

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true> *this,
          pair<llvm::StringRef,_unsigned_int> *Elt)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  
  if ((this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
      super_SmallVectorBase.Size) {
    SmallVectorTemplateBase<std::pair<llvm::StringRef,unsigned_int>,true>::push_back(this);
  }
  pvVar3 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
           super_SmallVectorBase.BeginX;
  uVar5 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
                 super_SmallVectorBase.Size;
  *(undefined8 *)((long)pvVar3 + uVar5 * 0x18 + 0x10) = *(undefined8 *)&Elt->second;
  sVar4 = (Elt->first).Length;
  puVar1 = (undefined8 *)((long)pvVar3 + uVar5 * 0x18);
  *puVar1 = (Elt->first).Data;
  puVar1[1] = sVar4;
  uVar2 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
          super_SmallVectorBase.Size;
  if (uVar2 < (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>
              ).super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
    super_SmallVectorBase.Size = uVar2 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }